

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

size_t luaO_str2num(char *s,TValue *o)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  lconv *plVar7;
  lu_byte lVar8;
  int mode;
  int mode_00;
  lua_Number lVar9;
  int iVar10;
  byte *pbVar11;
  byte *pbVar12;
  lua_Number n;
  char local_108 [216];
  
  pbVar11 = (byte *)s;
  do {
    pbVar12 = pbVar11;
    bVar1 = *pbVar12;
    uVar4 = (ulong)bVar1;
    pbVar11 = pbVar12 + 1;
  } while ((""[uVar4 + 1] & 8) != 0);
  if (bVar1 == 0x2b) {
    iVar10 = 0;
LAB_0010cd0e:
    uVar4 = (ulong)*pbVar11;
    pbVar12 = pbVar11;
  }
  else {
    if (bVar1 == 0x2d) {
      iVar10 = 1;
      goto LAB_0010cd0e;
    }
    iVar10 = 0;
  }
  if (((char)uVar4 == '0') && ((pbVar12[1] | 0x20) == 0x78)) {
    pbVar12 = pbVar12 + 2;
    bVar2 = true;
    lVar9 = 0.0;
    while( true ) {
      if ((""[(ulong)*pbVar12 + 1] & 0x10) == 0) break;
      iVar3 = luaO_hexavalue((int)(char)*pbVar12);
      lVar9 = (lua_Number)((long)lVar9 * 0x10 + (long)iVar3);
      pbVar12 = pbVar12 + 1;
      bVar2 = false;
    }
  }
  else {
    bVar2 = true;
    lVar9 = 0.0;
    while( true ) {
      if ((""[uVar4 + 1] & 2) == 0) break;
      iVar3 = (char)uVar4 + -0x30;
      if ((0xccccccccccccccb < (ulong)lVar9) &&
         ((lVar9 != 5.1488004017107686e-247 || (iVar10 + 7 < iVar3)))) goto LAB_0010cdcf;
      lVar9 = (lua_Number)((long)iVar3 + (long)lVar9 * 10);
      uVar4 = (ulong)pbVar12[1];
      pbVar12 = pbVar12 + 1;
      bVar2 = false;
    }
  }
  pbVar12 = pbVar12 + -1;
  do {
    pbVar11 = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
  } while ((""[(ulong)*pbVar11 + 1] & 8) != 0);
  if ((bVar2) || (*pbVar11 != 0)) {
LAB_0010cdcf:
    pbVar11 = (byte *)strpbrk(s,".xXnN");
    if ((pbVar11 == (byte *)0x0) || ((*pbVar11 & 0xdf) != 0x4e)) {
      pbVar12 = (byte *)l_str2dloc(s,&n,mode);
      if (pbVar12 != (byte *)0x0) {
LAB_0010ce04:
        lVar8 = '\x13';
        goto LAB_0010ce0b;
      }
      pcVar5 = strchr(s,0x2e);
      if (pcVar5 != (char *)0x0) {
        sVar6 = strlen(s);
        if (sVar6 < 0xc9) {
          strcpy(local_108,s);
          plVar7 = localeconv();
          pcVar5[(long)(local_108 + -(long)s)] = *plVar7->decimal_point;
          pcVar5 = l_str2dloc(local_108,&n,mode_00);
          if (s != (char *)0x0 && pcVar5 != (char *)0x0) {
            pbVar12 = (byte *)(s + ((long)pcVar5 - (long)local_108));
            goto LAB_0010ce04;
          }
        }
      }
    }
    pbVar12 = (byte *)0x0;
  }
  else {
    n = (lua_Number)-(long)lVar9;
    if (iVar10 == 0) {
      n = lVar9;
    }
    lVar8 = '\x03';
LAB_0010ce0b:
    (o->value_).i = (lua_Integer)n;
    o->tt_ = lVar8;
    pbVar12 = pbVar12 + (1 - (long)s);
  }
  return (size_t)pbVar12;
}

Assistant:

size_t luaO_str2num (const char *s, TValue *o) {
  lua_Integer i; lua_Number n;
  const char *e;
  if ((e = l_str2int(s, &i)) != NULL) {  /* try as an integer */
    setivalue(o, i);
  }
  else if ((e = l_str2d(s, &n)) != NULL) {  /* else try as a float */
    setfltvalue(o, n);
  }
  else
    return 0;  /* conversion failed */
  return (e - s) + 1;  /* success; return string size */
}